

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emmy_debugger.cpp
# Opt level: O0

void __thiscall
Debugger::GetVariable
          (Debugger *this,lua_State *L,Idx<Variable> variable,int index,int depth,bool queryHelper)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  Variable *pVVar4;
  ulong uVar5;
  size_t sVar6;
  ArenaClass *pAVar7;
  ostream *poVar8;
  Idx<Variable> IVar9;
  Idx<Variable> variable_00;
  Idx<Variable> variable_01;
  Idx<Variable> variable_02;
  Idx<Variable> variable_03;
  Idx<Variable> variable_04;
  Idx<Variable> variable_05;
  Idx<Variable> variable_06;
  string local_388 [4];
  int t2;
  stringstream local_368 [8];
  stringstream ss;
  ostream local_358 [376];
  undefined8 local_1e0;
  undefined1 local_1d8 [12];
  undefined4 uStack_1cc;
  Idx<Variable> v_2;
  undefined1 local_1b0 [8];
  Idx<Variable> metatable;
  string local_190;
  string local_170;
  string local_150;
  lua_Number local_130;
  lua_Number number;
  undefined1 auStack_120 [4];
  int t;
  Idx<Variable> v_1;
  void *tableAddr;
  size_t tableSize;
  undefined8 local_e0;
  Idx<Variable> local_d8;
  Idx<Variable> local_c8;
  string local_b0;
  int local_8c;
  char *pcStack_88;
  int result;
  char *string;
  undefined8 uStack_78;
  bool v;
  Idx<Variable> local_70;
  Idx<Variable> local_60;
  char *typeName;
  undefined8 uStack_48;
  int type;
  Idx<Variable> local_40;
  int topIndex;
  int iStack_2c;
  bool queryHelper_local;
  int depth_local;
  int index_local;
  lua_State *L_local;
  Debugger *this_local;
  Idx<Variable> variable_local;
  
  variable_local._0_8_ = variable._arena;
  this_local._0_4_ = variable.Raw;
  local_40._arena._7_1_ = queryHelper;
  _depth_local = L;
  if (L == (lua_State *)0x0) {
    _depth_local = this->currentL;
  }
  if ((_depth_local != (lua_State *)0x0) && (0 < depth)) {
    topIndex = depth;
    iStack_2c = index;
    L_local = (lua_State *)this;
    local_40._arena._0_4_ = (*lua_gettop)(_depth_local);
    iStack_2c = lua_absindex(_depth_local,iStack_2c);
    uStack_48 = CONCAT44(this_local._4_4_,(uint32_t)this_local);
    local_40.Raw = variable_local.Raw;
    local_40._4_4_ = variable_local._4_4_;
    IVar9._4_4_ = 0;
    IVar9.Raw = (uint32_t)this_local;
    IVar9._arena = (ArenaClass *)variable_local._0_8_;
    CacheValue(this,iStack_2c,IVar9);
    typeName._4_4_ = (*lua_type)(_depth_local,iStack_2c);
    pcVar3 = (*lua_typename)(_depth_local,typeName._4_4_);
    local_60._arena = (ArenaClass *)pcVar3;
    pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
    std::__cxx11::string::operator=((string *)&pVVar4->valueTypeName,pcVar3);
    iVar2 = typeName._4_4_;
    pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
    pVVar4->valueType = iVar2;
    if ((local_40._arena._7_1_ & 1) != 0) {
      if (((((this->displayCustomTypeInfo & 1U) != 0) && (-1 < typeName._4_4_)) &&
          (uVar5 = (ulong)typeName._4_4_, sVar6 = std::bitset<9UL>::size(&this->registeredTypes),
          uVar5 < sVar6)) &&
         (bVar1 = std::bitset<9UL>::test(&this->registeredTypes,(long)typeName._4_4_), bVar1)) {
        local_70._arena = (ArenaClass *)CONCAT44(this_local._4_4_,(uint32_t)this_local);
        local_60.Raw = variable_local.Raw;
        local_60._4_4_ = variable_local._4_4_;
        variable_00._4_4_ = 0;
        variable_00.Raw = (uint32_t)this_local;
        variable_00._arena = (ArenaClass *)variable_local._0_8_;
        bVar1 = ExtensionPoint::QueryVariableCustom
                          (&this->manager->extension,_depth_local,variable_00,
                           (char *)local_60._arena,iStack_2c,topIndex);
        if (bVar1) {
          return;
        }
      }
      if (((typeName._4_4_ == 5) || (typeName._4_4_ == 7)) || (typeName._4_4_ == 6)) {
        uStack_78 = CONCAT44(this_local._4_4_,(uint32_t)this_local);
        local_70.Raw = variable_local.Raw;
        local_70._4_4_ = variable_local._4_4_;
        variable_01._4_4_ = 0;
        variable_01.Raw = (uint32_t)this_local;
        variable_01._arena = (ArenaClass *)variable_local._0_8_;
        bVar1 = ExtensionPoint::QueryVariable
                          (&this->manager->extension,_depth_local,variable_01,
                           (char *)local_60._arena,iStack_2c,topIndex);
        if (bVar1) {
          return;
        }
      }
    }
    switch(typeName._4_4_) {
    case 0:
      pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
      std::__cxx11::string::operator=((string *)&pVVar4->value,"nil");
      break;
    case 1:
      iVar2 = (*lua_toboolean)(_depth_local,iStack_2c);
      string._7_1_ = iVar2 != 0;
      pcVar3 = "false";
      if ((bool)string._7_1_) {
        pcVar3 = "true";
      }
      pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
      std::__cxx11::string::operator=((string *)&pVVar4->value,pcVar3);
      break;
    case 2:
    case 8:
      ToPointer_abi_cxx11_((string *)&tableSize,_depth_local,iStack_2c);
      pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
      std::__cxx11::string::operator=((string *)&pVVar4->value,(string *)&tableSize);
      std::__cxx11::string::~string((string *)&tableSize);
      break;
    case 3:
      pcVar3 = (*lua_tolstring)(_depth_local,iStack_2c,(size_t *)0x0);
      pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
      std::__cxx11::string::operator=((string *)&pVVar4->value,pcVar3);
      break;
    case 4:
      pcVar3 = (*lua_tolstring)(_depth_local,iStack_2c,(size_t *)0x0);
      pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
      std::__cxx11::string::operator=((string *)&pVVar4->value,pcVar3);
      break;
    case 5:
      tableAddr = (void *)0x0;
      v_1._arena = (ArenaClass *)(*lua_topointer)(_depth_local,iStack_2c);
      (*lua_pushnil)(_depth_local);
      while (iVar2 = (*lua_next)(_depth_local,iStack_2c), iVar2 != 0) {
        if (1 < topIndex) {
          pAVar7 = Idx<Variable>::GetArena((Idx<Variable> *)&this_local);
          IVar9 = Arena<Variable>::Alloc(pAVar7);
          v_1._0_8_ = IVar9._arena;
          auStack_120 = (undefined1  [4])IVar9.Raw;
          iVar2 = (*lua_type)(_depth_local,-2);
          number._4_4_ = iVar2;
          pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)auStack_120);
          pVVar4->nameType = iVar2;
          if (number._4_4_ == 1) {
            iVar2 = (*lua_toboolean)(_depth_local,-2);
            pcVar3 = "false";
            if (iVar2 != 0) {
              pcVar3 = "true";
            }
            pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)auStack_120);
            std::__cxx11::string::operator=((string *)&pVVar4->name,pcVar3);
          }
          else if (number._4_4_ == 3) {
            local_130 = lua_tonumber(_depth_local,-2);
            if (((double)(long)local_130 != local_130) ||
               (NAN((double)(long)local_130) || NAN(local_130))) {
              std::__cxx11::to_string(&local_170,local_130);
              pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)auStack_120);
              std::__cxx11::string::operator=((string *)&pVVar4->name,(string *)&local_170);
              std::__cxx11::string::~string((string *)&local_170);
            }
            else {
              std::__cxx11::to_string(&local_150,(long)local_130);
              pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)auStack_120);
              std::__cxx11::string::operator=((string *)&pVVar4->name,(string *)&local_150);
              std::__cxx11::string::~string((string *)&local_150);
            }
          }
          else if (number._4_4_ == 4) {
            pcVar3 = (*lua_tolstring)(_depth_local,-2,(size_t *)0x0);
            pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)auStack_120);
            std::__cxx11::string::operator=((string *)&pVVar4->name,pcVar3);
          }
          else {
            ToPointer_abi_cxx11_(&local_190,_depth_local,-2);
            pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)auStack_120);
            std::__cxx11::string::operator=((string *)&pVVar4->name,(string *)&local_190);
            std::__cxx11::string::~string((string *)&local_190);
          }
          metatable._arena = (ArenaClass *)CONCAT44(t,auStack_120);
          variable_03._4_4_ = 0;
          variable_03.Raw = (uint32_t)auStack_120;
          variable_03._arena = (ArenaClass *)v_1._0_8_;
          GetVariable(this,_depth_local,variable_03,-1,topIndex + -1,true);
          pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
          std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                    (&pVVar4->children,(value_type *)auStack_120);
        }
        (*lua_settop)(_depth_local,-2);
        tableAddr = (void *)((long)tableAddr + 1);
      }
      iVar2 = (*lua_getmetatable)(_depth_local,iStack_2c);
      if (iVar2 != 0) {
        pAVar7 = Idx<Variable>::GetArena((Idx<Variable> *)&this_local);
        IVar9 = Arena<Variable>::Alloc(pAVar7);
        metatable._0_8_ = IVar9._arena;
        local_1b0._0_4_ = IVar9.Raw;
        pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)local_1b0);
        std::__cxx11::string::operator=((string *)&pVVar4->name,"(metatable)");
        iVar2 = (*lua_type)(_depth_local,-1);
        pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)local_1b0);
        pVVar4->nameType = iVar2;
        v_2._arena = (ArenaClass *)CONCAT44(local_1b0._4_4_,local_1b0._0_4_);
        variable_04._4_4_ = 0;
        variable_04.Raw = local_1b0._0_4_;
        variable_04._arena = (ArenaClass *)metatable._0_8_;
        GetVariable(this,_depth_local,variable_04,-1,topIndex + -1,true);
        pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
        std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                  (&pVVar4->children,(value_type *)local_1b0);
        iVar2 = (*lua_type)(_depth_local,-1);
        if (iVar2 == 5) {
          (*lua_pushstring)(_depth_local,"__index");
          (*lua_rawget)(_depth_local,-2);
          iVar2 = (*lua_type)(_depth_local,-1);
          if (iVar2 != 0) {
            pAVar7 = Idx<Variable>::GetArena((Idx<Variable> *)&this_local);
            IVar9 = Arena<Variable>::Alloc(pAVar7);
            v_2._0_8_ = IVar9._arena;
            local_1d8._8_4_ = IVar9.Raw;
            pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)(local_1d8 + 8));
            std::__cxx11::string::operator=((string *)&pVVar4->name,"(metatable.__index)");
            iVar2 = (*lua_type)(_depth_local,-1);
            pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)(local_1d8 + 8));
            pVVar4->nameType = iVar2;
            local_1e0 = CONCAT44(uStack_1cc,local_1d8._8_4_);
            local_1d8._0_8_ = v_2._0_8_;
            variable_05._4_4_ = 0;
            variable_05.Raw = local_1d8._8_4_;
            variable_05._arena = (ArenaClass *)v_2._0_8_;
            GetVariable(this,_depth_local,variable_05,-1,topIndex + -1,true);
            pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
            std::vector<Idx<Variable>,_std::allocator<Idx<Variable>_>_>::push_back
                      (&pVVar4->children,(value_type *)(local_1d8 + 8));
          }
          (*lua_settop)(_depth_local,-2);
        }
        (*lua_settop)(_depth_local,-2);
      }
      std::__cxx11::stringstream::stringstream(local_368);
      poVar8 = std::operator<<(local_358,"table(0x");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::hex);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,v_1._arena);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,std::dec);
      poVar8 = std::operator<<(poVar8,", size = ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(ulong)tableAddr);
      std::operator<<(poVar8,")");
      std::__cxx11::stringstream::str();
      pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
      std::__cxx11::string::operator=((string *)&pVVar4->value,local_388);
      std::__cxx11::string::~string(local_388);
      std::__cxx11::stringstream::~stringstream(local_368);
      break;
    case 6:
      local_e0 = CONCAT44(this_local._4_4_,(uint32_t)this_local);
      local_d8.Raw = variable_local.Raw;
      local_d8._4_4_ = variable_local._4_4_;
      variable_06._4_4_ = 0;
      variable_06.Raw = (uint32_t)this_local;
      variable_06._arena = (ArenaClass *)variable_local._0_8_;
      DisplayFunction(variable_06,_depth_local,iStack_2c);
      break;
    case 7:
      pcStack_88 = (*lua_tolstring)(_depth_local,iStack_2c,(size_t *)0x0);
      if (((pcStack_88 == (char *)0x0) &&
          (bVar1 = CallMetaFunction(_depth_local,(int)local_40._arena,"__tostring",1,&local_8c),
          bVar1)) && (local_8c == 0)) {
        pcStack_88 = (*lua_tolstring)(_depth_local,-1,(size_t *)0x0);
        (*lua_settop)(_depth_local,-2);
      }
      pcVar3 = pcStack_88;
      if (pcStack_88 == (char *)0x0) {
        ToPointer_abi_cxx11_(&local_b0,_depth_local,iStack_2c);
        pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
        std::__cxx11::string::operator=((string *)&pVVar4->value,(string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
      }
      else {
        pVVar4 = Idx<Variable>::operator->((Idx<Variable> *)&this_local);
        std::__cxx11::string::operator=((string *)&pVVar4->value,pcVar3);
      }
      if ((1 < topIndex) && (iVar2 = (*lua_getmetatable)(_depth_local,iStack_2c), iVar2 != 0)) {
        local_d8._arena = (ArenaClass *)CONCAT44(this_local._4_4_,(uint32_t)this_local);
        local_c8.Raw = variable_local.Raw;
        local_c8._4_4_ = variable_local._4_4_;
        variable_02._4_4_ = 0;
        variable_02.Raw = (uint32_t)this_local;
        variable_02._arena = (ArenaClass *)variable_local._0_8_;
        GetVariable(this,_depth_local,variable_02,-1,topIndex,true);
        (*lua_settop)(_depth_local,-2);
      }
    }
    iVar2 = (*lua_gettop)(_depth_local);
    if (iVar2 != (int)local_40._arena) {
      __assert_fail("t2 == topIndex",
                    "/workspace/llm4binary/github/license_c_cmakelists/EmmyLua[P]EmmyLuaDebugger/emmy_debugger/src/debugger/emmy_debugger.cpp"
                    ,0x208,"void Debugger::GetVariable(lua_State *, Idx<Variable>, int, int, bool)")
      ;
    }
  }
  return;
}

Assistant:

void Debugger::GetVariable(lua_State *L, Idx<Variable> variable, int index, int depth, bool queryHelper) {
	if (!L) {
		L = currentL;
	}

	if (!L) {
		return;
	}

	// 如果没有计算深度则不予计算
	if (depth <= 0) {
		return;
	}

	const int topIndex = lua_gettop(L);
	index = lua_absindex(L, index);
	CacheValue(index, variable);
	const int type = lua_type(L, index);
	const char *typeName = lua_typename(L, type);
	variable->valueTypeName = typeName;
	variable->valueType = type;

	if (queryHelper) {
		if (displayCustomTypeInfo && type >= 0 && type < registeredTypes.size() && registeredTypes.test(type)
			&& manager->extension.QueryVariableCustom(L, variable, typeName, index, depth)) {
			return;
		}
		else if ((type == LUA_TTABLE || type == LUA_TUSERDATA || type == LUA_TFUNCTION)
			&& manager->extension.QueryVariable(L, variable, typeName, index, depth)) {
			return;
		}
	}
	switch (type) {
		case LUA_TNIL: {
			variable->value = "nil";
			break;
		}
		case LUA_TNUMBER: {
			variable->value = lua_tostring(L, index);
			break;
		}
		case LUA_TBOOLEAN: {
			const bool v = lua_toboolean(L, index);
			variable->value = v ? "true" : "false";
			break;
		}
		case LUA_TSTRING: {
			variable->value = lua_tostring(L, index);
			break;
		}
		case LUA_TUSERDATA: {
			auto *string = lua_tostring(L, index);
			if (string == nullptr) {
				int result;
				if (CallMetaFunction(L, topIndex, "__tostring", 1, result) && result == 0) {
					string = lua_tostring(L, -1);
					lua_pop(L, 1);
				}
			}
			if (string) {
				variable->value = string;
			} else {
				variable->value = ToPointer(L, index);
			}
			if (depth > 1) {
				if (lua_getmetatable(L, index)) {
					GetVariable(L, variable, -1, depth);
					lua_pop(L, 1);//pop meta
				}
			}
			break;
		}
		case LUA_TFUNCTION: {
#ifndef EMMY_USE_LUA_SOURCE
			DisplayFunction(variable, L, index);
#else
			variable->value = ToPointer(L, index);
#endif

			break;
		}
		case LUA_TLIGHTUSERDATA:
		case LUA_TTHREAD: {
			variable->value = ToPointer(L, index);
			break;
		}
		case LUA_TTABLE: {
			std::size_t tableSize = 0;
			const void *tableAddr = lua_topointer(L, index);
			lua_pushnil(L);
			while (lua_next(L, index)) {
				// k: -2, v: -1
				if (depth > 1) {
					//todo: use allocator
					auto v = variable.GetArena()->Alloc();
					const auto t = lua_type(L, -2);
					v->nameType = t;
                    switch (t) {
                        case LUA_TSTRING:
                        {
                            v->name = lua_tostring(L, -2);
                            break;
                        }
                        case LUA_TNUMBER:
                        {
                            auto number = lua_tonumber(L, -2);
                            if (static_cast<long long>(number) == number) {
                                v->name = std::to_string(static_cast<long long>(number));
                            } else {
                                v->name = std::to_string(number);
                            }
                            break;
                        }
                        case LUA_TBOOLEAN:
                        {
                            v->name = lua_toboolean(L, -2) ? "true" : "false";
                            break;
                        }
                        default: {
                            v->name = ToPointer(L, -2);
                            break;
                        }
                    }

					GetVariable(L, v, -1, depth - 1);
					variable->children.push_back(v);
				}
				lua_pop(L, 1);
				tableSize++;
			}


			if (lua_getmetatable(L, index)) {
				// metatable
				auto metatable = variable.GetArena()->Alloc();
				metatable->name = "(metatable)";
				metatable->nameType = lua_type(L, -1);

				GetVariable(L, metatable, -1, depth - 1);
				variable->children.push_back(metatable);

				//__index
				if (lua_istable(L, -1)) {
					// fix BUG 导致涉及到FGUI的框架崩溃
					lua_pushstring(L, "__index");
					lua_rawget(L, -2);
					if (!lua_isnil(L, -1)) {
						auto v = variable.GetArena()->Alloc();
						v->name = "(metatable.__index)";
						v->nameType = lua_type(L, -1);
						GetVariable(L, v, -1, depth - 1);
						variable->children.push_back(v);
					}
					lua_pop(L, 1);
				}

				// metatable
				lua_pop(L, 1);
			}

			std::stringstream ss;
			ss << "table(0x" << std::hex << tableAddr << std::dec << ", size = " << tableSize << ")";
			variable->value = ss.str();
			break;
		}
	}
	const int t2 = lua_gettop(L);
	assert(t2 == topIndex);
}